

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find.hpp
# Opt level: O1

enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
toml::find_or<toml::type_config,char[8]>
          (basic_value<toml::type_config> *v,char (*k) [8],basic_value<toml::type_config> *opt)

{
  value_type *pvVar1;
  allocator<char> local_31;
  key_type local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,*k,&local_31);
  pvVar1 = basic_value<toml::type_config>::at(v,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pvVar1;
}

Assistant:

cxx::enable_if_t<detail::is_type_config<TC>::value, basic_value<TC>>&
find_or(basic_value<TC>& v, const K& k, basic_value<TC>& opt) noexcept
{
    try
    {
        return ::toml::find(v, detail::key_cast<TC>(k));
    }
    catch(...)
    {
        return opt;
    }
}